

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O0

void __thiscall
OpenMD::ZConstraintForceModifier::~ZConstraintForceModifier(ZConstraintForceModifier *this)

{
  ForceModifier *in_RDI;
  vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *unaff_retaddr;
  ZConsWriter *this_00;
  
  in_RDI->_vptr_ForceModifier = (_func_int **)&PTR__ZConstraintForceModifier_0050b160;
  this_00 = (ZConsWriter *)in_RDI[0x10]._vptr_ForceModifier;
  if (this_00 != (ZConsWriter *)0x0) {
    ZConsWriter::~ZConsWriter(this_00);
    operator_delete(this_00,0x208);
  }
  std::
  map<int,_OpenMD::ZconstraintParam,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZconstraintParam>_>_>
  ::~map((map<int,_OpenMD::ZconstraintParam,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZconstraintParam>_>_>
          *)0x326d1b);
  std::__cxx11::string::~string((string *)(in_RDI + 6));
  std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::~vector(unaff_retaddr);
  std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::~list
            ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)0x326d42);
  std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::~list
            ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)0x326d4f);
  ForceModifier::~ForceModifier(in_RDI);
  return;
}

Assistant:

ZConstraintForceModifier::~ZConstraintForceModifier() { delete fzOut; }